

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedWriteGeometry::Run(AdvancedWriteGeometry *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  GLuint GVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int h;
  vec3 *expected;
  long lVar7;
  float data [8];
  string local_d8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInGS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar7 = 0x10;
  if (bVar3) {
    paVar1 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,"");
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,0x1b3c1e9);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b3c1e9);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "\nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(std430, binding = 1) buffer OutputBuffer {\n  vec4 g_output_buffer[];\n};\nvoid main() {\n  for (int i = 0; i < 3; ++i) {\n    const int idx = gl_PrimitiveIDIn * 3 + i;\n    g_output_buffer[idx] = gl_in[i].gl_Position;\n    gl_Position = g_output_buffer[idx];\n    EmitVertex();\n  }\n}"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,"");
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_d8,&local_b0,&local_50,
                       &local_70,&local_90);
    this->m_program[0] = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[0]);
    lVar7 = -1;
    if (bVar3) {
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
                 ,"");
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
                 ,"");
      GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,&local_d8,&local_b0);
      this->m_program[1] = GVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
      bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program[1]);
      if (bVar3) {
        local_d8.field_2._M_allocated_capacity = 0x3f800000bf800000;
        local_d8.field_2._8_8_ = &DAT_3f8000003f800000;
        local_d8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
        local_d8._M_string_length = 0xbf8000003f800000;
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_d8,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x60,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glGenVertexArrays(this_00,2,this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_storage_buffer);
        h = 0;
        expected = (vec3 *)0x0;
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
        iVar6 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        local_d8._M_dataplus._M_p = (pointer)0x3f80000000000000;
        local_d8._M_string_length = local_d8._M_string_length & 0xffffffff00000000;
        bVar3 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,iVar5,
                           *(int *)(CONCAT44(extraout_var_00,iVar6) + 4),(int)&local_d8,h,expected);
        if (bVar3) {
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
          glu::CallLogWrapper::glMemoryBarrier(this_00,1);
          glu::CallLogWrapper::glDrawArrays(this_00,4,0,6);
          iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar5 = *(int *)CONCAT44(extraout_var_01,iVar5);
          iVar6 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          local_d8._M_dataplus._M_p = (pointer)0x3f80000000000000;
          local_d8._M_string_length = local_d8._M_string_length & 0xffffffff00000000;
          bVar3 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                            (&this->super_ShaderStorageBufferObjectBase,iVar5,
                             *(int *)(CONCAT44(extraout_var_02,iVar6) + 4),(int)&local_d8,h,expected
                            );
          lVar7 = (ulong)bVar3 - 1;
        }
      }
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInGS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_gs =
			NL "layout(triangles) in;" NL "layout(triangle_strip, max_vertices = 3) out;" NL
			   "layout(std430, binding = 1) buffer OutputBuffer {" NL "  vec4 g_output_buffer[];" NL "};" NL
			   "void main() {" NL "  for (int i = 0; i < 3; ++i) {" NL
			   "    const int idx = gl_PrimitiveIDIn * 3 + i;" NL "    g_output_buffer[idx] = gl_in[i].gl_Position;" NL
			   "    gl_Position = g_output_buffer[idx];" NL "    EmitVertex();" NL "  }" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program[0] = CreateProgram(glsl_vs, "", "", glsl_gs, glsl_fs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, -1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * sizeof(float) * 4, NULL, GL_DYNAMIC_DRAW);

		glGenVertexArrays(2, m_vertex_array);

		glBindVertexArray(m_vertex_array[0]);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glBindVertexArray(m_vertex_array[1]);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array[0]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array[1]);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLES, 0, 6);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}